

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNode.h
# Opt level: O2

void __thiscall dg::LLVMNode::LLVMNode(LLVMNode *this,Value *val,bool owns_value)

{
  undefined3 in_register_00000011;
  pointer local_28;
  __uniq_ptr_impl<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> local_20;
  
  local_28 = val;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::Node
            (&this->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,&local_28);
  (this->owned_key)._M_t.super___uniq_ptr_impl<llvm::Value,_dg::LLVMNode::LLVMValueDeleter>._M_t.
  super__Tuple_impl<0UL,_llvm::Value_*,_dg::LLVMNode::LLVMValueDeleter>.
  super__Head_base<0UL,_llvm::Value_*,_false>._M_head_impl = (Value *)0x0;
  if (CONCAT31(in_register_00000011,owns_value) != 0) {
    local_20._M_t.super__Tuple_impl<0UL,_llvm::Value_*,_dg::LLVMNode::LLVMValueDeleter>.
    super__Head_base<0UL,_llvm::Value_*,_false>._M_head_impl =
         (tuple<llvm::Value_*,_dg::LLVMNode::LLVMValueDeleter>)
         (_Tuple_impl<0UL,_llvm::Value_*,_dg::LLVMNode::LLVMValueDeleter>)0x0;
    std::__uniq_ptr_impl<llvm::Value,_dg::LLVMNode::LLVMValueDeleter>::reset
              ((__uniq_ptr_impl<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)&this->owned_key,
               local_28);
    std::unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter>::~unique_ptr
              ((unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)&local_20);
  }
  return;
}

Assistant:

LLVMNode(llvm::Value *val, bool owns_value = false)
            : dg::Node<LLVMDependenceGraph, llvm::Value *, LLVMNode>(val) {
        if (owns_value)
#if LLVM_VERSION_MAJOR >= 5
            owned_key = std::unique_ptr<llvm::Value, LLVMValueDeleter>(val);
#else
            owned_key = std::unique_ptr<llvm::Value>(val);
#endif
    }